

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_7f1d8::testVector(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar1;
  ostream *poVar2;
  Value *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  allocator<char> local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  iterator local_2e8;
  size_type local_2e0;
  undefined1 local_2d2;
  allocator<char> local_2d1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  iterator local_2a8;
  size_type local_2a0;
  Value local_298;
  undefined1 local_26a;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  iterator local_240;
  size_type local_238;
  Value local_230;
  undefined4 local_204;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fd;
  undefined1 local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0 [32];
  string local_1b0 [32];
  iterator local_190;
  size_type local_188;
  undefined1 local_180 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  Value local_e8;
  Value local_b0;
  undefined1 local_88 [8];
  cmJSONState state;
  Value v;
  
  Json::Value::Value((Value *)((long)&state.doc.field_2 + 8),arrayValue);
  cmJSONState::cmJSONState((cmJSONState *)local_88);
  Json::Value::Value(&local_b0,"Hello");
  Json::Value::append((Value *)((long)&state.doc.field_2 + 8),&local_b0);
  Json::Value::~Value(&local_b0);
  Json::Value::Value(&local_e8,"world!");
  Json::Value::append((Value *)((long)&state.doc.field_2 + 8),&local_e8);
  Json::Value::~Value(&local_e8);
  Json::Value::Value((Value *)&l.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ignore");
  Json::Value::append((Value *)((long)&state.doc.field_2 + 8),
                      (Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"default",
             (allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_138 = &local_158;
  local_130 = 1;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&expected.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_03._M_len = local_130;
  __l_03._M_array = local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_128,__l_03,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&expected.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138;
  do {
    local_338 = local_338 + -1;
    std::__cxx11::string::~string((string *)local_338);
  } while (local_338 != &local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1fc = 1;
  local_1f8 = &local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Hello",&local_1f9);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"world!",&local_1fa);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"ignore",&local_1fb);
  local_1fc = 0;
  local_190 = &local_1f0;
  local_188 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1fd);
  __l_02._M_len = local_188;
  __l_02._M_array = local_190;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_180,__l_02,&local_1fd);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1fd);
  local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  do {
    local_388 = local_388 + -1;
    std::__cxx11::string::~string((string *)local_388);
  } while (local_388 != &local_1f0);
  std::allocator<char>::~allocator(&local_1fb);
  std::allocator<char>::~allocator(&local_1fa);
  std::allocator<char>::~allocator(&local_1f9);
  bVar1 = std::
          function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                        *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_128,(Value *)((long)&state.doc.field_2 + 8),(cmJSONState *)local_88)
  ;
  if (bVar1) {
    bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_128,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_180);
    if (bVar1) {
      Json::Value::Value(&local_230,2);
      this_00 = Json::Value::operator[]((Value *)((long)&state.doc.field_2 + 8),1);
      Json::Value::operator=(this_00,&local_230);
      Json::Value::~Value(&local_230);
      local_26a = 1;
      local_268 = &local_260;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"default",&local_269);
      local_26a = 0;
      local_240 = &local_260;
      local_238 = 1;
      __l_01._M_len = 1;
      __l_01._M_array = local_240;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128,__l_01);
      local_440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240;
      do {
        local_440 = local_440 + -1;
        std::__cxx11::string::~string((string *)local_440);
      } while (local_440 != &local_260);
      std::allocator<char>::~allocator(&local_269);
      bVar1 = std::
              function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                            *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_128,(Value *)((long)&state.doc.field_2 + 8),
                           (cmJSONState *)local_88);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!StringVectorHelper(l, &v, &state)) failed on line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x150);
        std::operator<<(poVar2,"\n");
        v.limit_._7_1_ = false;
      }
      else {
        Json::Value::Value(&local_298,"Hello");
        Json::Value::operator=((Value *)((long)&state.doc.field_2 + 8),&local_298);
        Json::Value::~Value(&local_298);
        local_2d2 = '\x01';
        local_2d1._1_8_ = &local_2c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"default",local_2d1)
        ;
        local_2d2 = '\0';
        local_2a8 = &local_2c8;
        local_2a0 = 1;
        __l_00._M_len = 1;
        __l_00._M_array = local_2a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128,__l_00);
        local_4b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8;
        do {
          local_4b0 = local_4b0 + -1;
          std::__cxx11::string::~string((string *)local_4b0);
        } while (local_4b0 != &local_2c8);
        std::allocator<char>::~allocator(local_2d1);
        bVar1 = std::
                function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                              *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_128,(Value *)((long)&state.doc.field_2 + 8),
                             (cmJSONState *)local_88);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!StringVectorHelper(l, &v, &state)) failed on line "
                                  );
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x154);
          std::operator<<(poVar2,"\n");
          v.limit_._7_1_ = false;
        }
        else {
          local_310 = &local_308;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_308,"default",&local_311);
          local_2e8 = &local_308;
          local_2e0 = 1;
          __l._M_len = 1;
          __l._M_array = local_2e8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_128,__l);
          local_518 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2e8;
          do {
            local_518 = local_518 + -1;
            std::__cxx11::string::~string((string *)local_518);
          } while (local_518 != &local_308);
          std::allocator<char>::~allocator(&local_311);
          bVar1 = std::
                  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                  ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                                *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_128,(Value *)0x0,(cmJSONState *)local_88);
          if (bVar1) {
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_128);
            if (bVar1) {
              v.limit_._7_1_ = true;
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(l.empty()) failed on line ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x158);
              std::operator<<(poVar2,"\n");
              v.limit_._7_1_ = false;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorHelper(l, nullptr, &state)) failed on line "
                                    );
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x157);
            std::operator<<(poVar2,"\n");
            v.limit_._7_1_ = false;
          }
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14c);
      std::operator<<(poVar2,"\n");
      v.limit_._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(StringVectorHelper(l, &v, &state)) failed on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14b);
    std::operator<<(poVar2,"\n");
    v.limit_._7_1_ = false;
  }
  local_204 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  cmJSONState::~cmJSONState((cmJSONState *)local_88);
  Json::Value::~Value((Value *)((long)&state.doc.field_2 + 8));
  return v.limit_._7_1_;
}

Assistant:

bool testVector()
{
  Json::Value v(Json::arrayValue);
  cmJSONState state;
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{ "Hello", "world!", "ignore" };
  ASSERT_TRUE(StringVectorHelper(l, &v, &state));
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(!StringVectorHelper(l, &v, &state));

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(!StringVectorHelper(l, &v, &state));

  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, nullptr, &state));
  ASSERT_TRUE(l.empty());

  return true;
}